

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
          (any_executor_base *this,
          binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
          *f)

{
  code *pcVar1;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  *in_RSI;
  long in_RDI;
  bad_executor ex;
  non_const_lvalue<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>_>
  f2;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  *in_stack_ffffffffffffff58;
  bad_executor *in_stack_ffffffffffffff60;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  *this_00;
  allocator<void> *in_stack_ffffffffffffff90;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  *in_stack_ffffffffffffff98;
  executor_function *in_stack_ffffffffffffffa0;
  undefined1 local_30 [8];
  executor_function_view local_28;
  non_const_lvalue<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>_>
  local_18 [3];
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    bad_executor::bad_executor(in_stack_ffffffffffffff60);
    asio::detail::throw_exception<asio::execution::bad_executor>(in_stack_ffffffffffffff60);
    bad_executor::~bad_executor((bad_executor *)0x704cbd);
  }
  else if (*(long *)(*(long *)(in_RDI + 0x28) + 0x18) == 0) {
    this_00 = *(binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
                **)(*(long *)(in_RDI + 0x28) + 0x10);
    asio::detail::
    binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
    ::binder0(this_00,in_stack_ffffffffffffff58);
    asio::detail::executor_function::
    executor_function<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    (*(code *)this_00)(in_RDI,local_30);
    asio::detail::executor_function::~executor_function((executor_function *)this_00);
    asio::detail::
    binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
    ::~binder0((binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
                *)0x704c62);
  }
  else {
    asio::detail::
    non_const_lvalue<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>_>
    ::non_const_lvalue(local_18,in_RSI);
    pcVar1 = *(code **)(*(long *)(in_RDI + 0x28) + 0x18);
    asio::detail::executor_function_view::
    executor_function_view<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
              (&local_28,local_18[0].value);
    (*pcVar1)(in_RDI,local_28.complete_,local_28.function_);
  }
  return;
}

Assistant:

void execute(F&& f) const
  {
    if (target_)
    {
      if (target_fns_->blocking_execute != 0)
      {
        asio::detail::non_const_lvalue<F> f2(f);
        target_fns_->blocking_execute(*this, function_view(f2.value));
      }
      else
      {
        target_fns_->execute(*this,
            function(static_cast<F&&>(f), std::allocator<void>()));
      }
    }
    else
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
  }